

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void output_features(io_buf *cache,uchar index,features *fs,uint64_t mask)

{
  float fVar1;
  float *pfVar2;
  ulong uVar3;
  bool bVar4;
  byte *pbVar5;
  float *__begin1;
  float *pfVar6;
  ulong *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  v_array<float> *__range1;
  byte *local_30;
  
  pfVar6 = (fs->values)._begin;
  pfVar2 = (fs->values)._end;
  lVar9 = ((long)pfVar2 - (long)pfVar6 >> 2) * 0xb;
  for (; pfVar2 != pfVar6; pfVar6 = pfVar6 + 1) {
    fVar1 = *pfVar6;
    lVar8 = lVar9;
    if (fVar1 != -1.0) {
      lVar8 = lVar9 + 4;
    }
    if (NAN(fVar1)) {
      lVar8 = lVar9 + 4;
    }
    if (fVar1 != 1.0) {
      lVar9 = lVar8;
    }
    if (NAN(fVar1)) {
      lVar9 = lVar8;
    }
  }
  io_buf::buf_write(cache,(char **)&local_30,lVar9 + 9);
  pbVar5 = local_30;
  *local_30 = index;
  local_30 = local_30 + 9;
  pfVar6 = (fs->values)._begin;
  pfVar2 = (fs->values)._end;
  if (pfVar6 != pfVar2) {
    puVar7 = (fs->indicies)._begin;
    uVar10 = 0;
    do {
      uVar3 = *puVar7;
      lVar9 = (uVar3 & mask) - uVar10;
      uVar10 = lVar9 >> 0x3d & 0xfffffffffffffffcU ^ lVar9 * 8;
      fVar1 = *pfVar6;
      if ((fVar1 != 1.0) || (NAN(fVar1))) {
        if ((fVar1 == -1.0) && (!NAN(fVar1))) {
          uVar12 = uVar10 | 1;
          uVar11 = uVar12;
          if (0x7f < uVar10) {
            do {
              *local_30 = (byte)uVar11 | 0x80;
              local_30 = local_30 + 1;
              uVar12 = uVar11 >> 7;
              bVar4 = 0x3fff < uVar11;
              uVar11 = uVar12;
            } while (bVar4);
          }
          *local_30 = (byte)uVar12;
          goto LAB_002354ac;
        }
        uVar12 = uVar10 | 2;
        uVar11 = uVar12;
        if (0x7f < uVar10) {
          do {
            *local_30 = (byte)uVar11 | 0x80;
            local_30 = local_30 + 1;
            uVar12 = uVar11 >> 7;
            bVar4 = 0x3fff < uVar11;
            uVar11 = uVar12;
          } while (bVar4);
        }
        *local_30 = (byte)uVar12;
        *(float *)(local_30 + 1) = *pfVar6;
        local_30 = local_30 + 5;
      }
      else {
        uVar11 = uVar10;
        if (0x7f < uVar10) {
          do {
            *local_30 = (byte)uVar10 | 0x80;
            local_30 = local_30 + 1;
            uVar11 = uVar10 >> 7;
            bVar4 = 0x3fff < uVar10;
            uVar10 = uVar11;
          } while (bVar4);
        }
        *local_30 = (byte)uVar11;
LAB_002354ac:
        local_30 = local_30 + 1;
      }
      pfVar6 = pfVar6 + 1;
      puVar7 = puVar7 + 1;
      uVar10 = uVar3 & mask;
    } while (pfVar6 != pfVar2);
  }
  cache->head = (char *)local_30;
  *(byte **)(pbVar5 + 1) = local_30 + (-8 - (long)(pbVar5 + 1));
  return;
}

Assistant:

void output_features(io_buf& cache, unsigned char index, features& fs, uint64_t mask)
{
  char* c;
  size_t storage = fs.size() * int_size;
  for (feature_value f : fs.values)
    if (f != 1. && f != -1.)
      storage += sizeof(feature_value);

  cache.buf_write(c, sizeof(index) + storage + sizeof(size_t));
  *reinterpret_cast<unsigned char*>(c) = index;
  c += sizeof(index);

  char* storage_size_loc = c;
  c += sizeof(size_t);

  uint64_t last = 0;
  for (features::iterator& f : fs)
  {
    feature_index fi = f.index() & mask;
    int64_t s_diff = (fi - last);
    uint64_t diff = ZigZagEncode(s_diff) << 2;
    last = fi;

    if (f.value() == 1.)
      c = run_len_encode(c, diff);
    else if (f.value() == -1.)
      c = run_len_encode(c, diff | neg_1);
    else
    {
      c = run_len_encode(c, diff | general);
      memcpy(c, &f.value(), sizeof(feature_value));
      c += sizeof(feature_value);
    }
  }

  cache.set(c);
  *(size_t*)storage_size_loc = c - storage_size_loc - sizeof(size_t);
}